

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,half4 *value)

{
  bool bVar1;
  half hVar2;
  reference pvVar3;
  reference pvVar4;
  undefined1 local_30 [8];
  float4 v;
  half4 *value_local;
  AsciiParser *this_local;
  
  v._M_elems._8_8_ = value;
  bVar1 = ReadBasicType(this,(float4 *)local_30);
  if (bVar1) {
    pvVar3 = ::std::array<float,_4UL>::operator[]((array<float,_4UL> *)local_30,0);
    hVar2 = tinyusdz::value::float_to_half_full(*pvVar3);
    pvVar4 = ::std::array<tinyusdz::value::half,_4UL>::operator[]
                       ((array<tinyusdz::value::half,_4UL> *)v._M_elems._8_8_,0);
    pvVar4->value = hVar2.value;
    pvVar3 = ::std::array<float,_4UL>::operator[]((array<float,_4UL> *)local_30,1);
    hVar2 = tinyusdz::value::float_to_half_full(*pvVar3);
    pvVar4 = ::std::array<tinyusdz::value::half,_4UL>::operator[]
                       ((array<tinyusdz::value::half,_4UL> *)v._M_elems._8_8_,1);
    pvVar4->value = hVar2.value;
    pvVar3 = ::std::array<float,_4UL>::operator[]((array<float,_4UL> *)local_30,2);
    hVar2 = tinyusdz::value::float_to_half_full(*pvVar3);
    pvVar4 = ::std::array<tinyusdz::value::half,_4UL>::operator[]
                       ((array<tinyusdz::value::half,_4UL> *)v._M_elems._8_8_,2);
    pvVar4->value = hVar2.value;
    pvVar3 = ::std::array<float,_4UL>::operator[]((array<float,_4UL> *)local_30,3);
    hVar2 = tinyusdz::value::float_to_half_full(*pvVar3);
    pvVar4 = ::std::array<tinyusdz::value::half,_4UL>::operator[]
                       ((array<tinyusdz::value::half,_4UL> *)v._M_elems._8_8_,3);
    pvVar4->value = hVar2.value;
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(value::half4 *value) {
  // Parse as float
  value::float4 v;
  if (!ReadBasicType(&v)) {
    return false;
  }

  (*value)[0] = value::float_to_half_full(v[0]);
  (*value)[1] = value::float_to_half_full(v[1]);
  (*value)[2] = value::float_to_half_full(v[2]);
  (*value)[3] = value::float_to_half_full(v[3]);
  return true;
}